

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveDisplayer.cpp
# Opt level: O1

GLfloat * __thiscall
PrimitiveDisplayer::vectorToArray
          (PrimitiveDisplayer *this,vector<Vec2d_*,_std::allocator<Vec2d_*>_> *vecs)

{
  undefined8 *puVar1;
  Vec2d *this_00;
  GLfloat *pGVar2;
  GLfloat *pGVar3;
  undefined8 *puVar4;
  float fVar5;
  
  pGVar2 = (GLfloat *)operator_new__(0x20);
  puVar4 = *(undefined8 **)vecs;
  puVar1 = *(undefined8 **)(vecs + 8);
  if (puVar4 != puVar1) {
    pGVar3 = pGVar2 + 1;
    do {
      this_00 = (Vec2d *)*puVar4;
      fVar5 = Vec2d::getX(this_00);
      pGVar3[-1] = fVar5;
      fVar5 = Vec2d::getY(this_00);
      *pGVar3 = fVar5;
      puVar4 = puVar4 + 1;
      pGVar3 = pGVar3 + 2;
    } while (puVar4 != puVar1);
  }
  return pGVar2;
}

Assistant:

GLfloat* PrimitiveDisplayer::vectorToArray(vector<Vec2d*>* vecs) {
    int i = 0;
    GLfloat* vertices = new GLfloat[8];
    for (auto vec : *vecs) {
        vertices[i++] = vec->getX();
        vertices[i++] = vec->getY();
    }
    return vertices;
}